

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

Cursor * __thiscall Table::leafNodeFind(Table *this,uint32_t pageNum,uint32_t key)

{
  uint32_t cell_num;
  char *node_00;
  uint32_t *puVar1;
  Cursor *pCVar2;
  uint32_t keyAtIndex;
  uint32_t index;
  uint32_t onePastMaxIndex;
  uint32_t minIndex;
  Cursor *c;
  uint32_t numOfCells;
  char *node;
  uint32_t key_local;
  uint32_t pageNum_local;
  Table *this_local;
  
  node_00 = Pager::getPage(this->pager,pageNum);
  puVar1 = leaf_node_num_cells(node_00);
  cell_num = *puVar1;
  pCVar2 = (Cursor *)operator_new(0x18);
  pCVar2->table = this;
  pCVar2->pageNum = pageNum;
  index = 0;
  while( true ) {
    keyAtIndex = cell_num;
    if (keyAtIndex == index) {
      pCVar2->cellNum = index;
      return pCVar2;
    }
    cell_num = keyAtIndex + index >> 1;
    puVar1 = leaf_node_key(node_00,cell_num);
    if (key == *puVar1) break;
    if (*puVar1 <= key) {
      index = cell_num + 1;
      cell_num = keyAtIndex;
    }
  }
  pCVar2->cellNum = cell_num;
  return pCVar2;
}

Assistant:

Cursor* Table::leafNodeFind(uint32_t pageNum, uint32_t key) {
	char *node = pager->getPage(pageNum);
	uint32_t numOfCells = *leaf_node_num_cells(node);

	Cursor *c = new Cursor;
	c->table = this;
	c->pageNum = pageNum;

	//Binary search
	uint32_t minIndex = 0;
	uint32_t onePastMaxIndex = numOfCells;
	while (onePastMaxIndex != minIndex) {
		uint32_t index = (onePastMaxIndex + minIndex) / 2;
		uint32_t keyAtIndex = *(leaf_node_key(node, index));
		if (key == keyAtIndex) {
			c->cellNum = index;
			return c;
		}
		if (key < keyAtIndex) {
			onePastMaxIndex = index;
		} else {
			minIndex = index + 1;
		}
	}

	c->cellNum = minIndex;
	return c;
}